

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Bool prvTidyCheckNodeIntegrity(Node *node)

{
  Bool BVar1;
  Node *local_20;
  Node *child;
  Node *node_local;
  
  if ((node->prev == (Node *)0x0) || (node->prev->next == node)) {
    if ((node->next == (Node *)0x0) || ((node->next != node && (node->next->prev == node)))) {
      if (node->parent != (Node *)0x0) {
        if ((node->prev == (Node *)0x0) && (node->parent->content != node)) {
          return no;
        }
        if ((node->next == (Node *)0x0) && (node->parent->last != node)) {
          return no;
        }
      }
      for (local_20 = node->content; local_20 != (Node *)0x0; local_20 = local_20->next) {
        if ((local_20->parent != node) || (BVar1 = prvTidyCheckNodeIntegrity(local_20), BVar1 == no)
           ) {
          return no;
        }
      }
      node_local._4_4_ = yes;
    }
    else {
      node_local._4_4_ = no;
    }
  }
  else {
    node_local._4_4_ = no;
  }
  return node_local._4_4_;
}

Assistant:

Bool TY_(CheckNodeIntegrity)(Node *node)
{
#ifndef NO_NODE_INTEGRITY_CHECK
    Node *child;

    if (node->prev)
    {
        if (node->prev->next != node)
            return no;
    }

    if (node->next)
    {
        if (node->next == node || node->next->prev != node)
            return no;
    }

    if (node->parent)
    {
        if (node->prev == NULL && node->parent->content != node)
            return no;

        if (node->next == NULL && node->parent->last != node)
            return no;
    }

    for (child = node->content; child; child = child->next)
        if ( child->parent != node || !TY_(CheckNodeIntegrity)(child) )
            return no;

#endif
    return yes;
}